

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void displayLine(void)

{
  int iVar1;
  
  iVar1 = 0x50;
  do {
    putchar(0xf);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  putchar(0xd);
  putchar(0xd);
  iVar1 = 0xc;
  do {
    putchar(9);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 6;
  do {
    putchar(0xd);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void displayLine() {

    // Display
    for(int i=0; i<(640/8); i++) {
        putchar(0b00001111);
    }

    // Front Porch
    for(int i=0; i<(16/8); i++) {
        putchar(0b00001101);
    }

    // hSync
    for(int i=0; i<(96/8); i++) {
        putchar(0b00001001);
    }

    // Back Porch
    for(int i=0; i<(48/8); i++) {
        putchar(0b00001101);
    }

}